

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress1X2_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined2 *puVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  int iVar7;
  ulong *puVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar10 = 0;
    uVar5 = 0;
    puVar8 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puVar6 = (ulong *)0x0;
  }
  else {
    puVar6 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar5 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar5 = uVar5 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar5 = uVar5 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar5 = uVar5 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar5 = uVar5 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar9 = (uint)bVar2;
        if (bVar2 == 0) {
          cSrcSize = 0xffffffffffffffec;
        }
        else {
          uVar9 = (LZCOUNT((uint)bVar2) ^ 0xffffffe0U) + (int)cSrcSize * -8 + 0x49;
        }
        uVar10 = (ulong)uVar9;
        puVar8 = (ulong *)cSrc;
      }
    }
    else {
      puVar8 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar5 = *puVar8;
      bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar9 = (LZCOUNT((uint)bVar2) ^ 0xffffffe0U) + 9;
      if (bVar2 == 0) {
        uVar9 = (uint)bVar2;
      }
      uVar10 = (ulong)uVar9;
      cSrcSize = cSrcSize | -(ulong)(bVar2 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined2 *)((long)dst + dstSize);
  uVar9 = *DTable;
  iVar7 = (int)cSrc;
  if (7 < dstSize) {
    uVar15 = -(uVar9 >> 0x10) & 0x3f;
    if (0xbffff < (uVar9 & 0xfc0000)) {
      do {
        uVar13 = (uint)uVar10;
        if (uVar13 < 0x41) {
          if (puVar8 < puVar6) {
            if (puVar8 == (ulong *)cSrc) goto LAB_001c147f;
            bVar16 = cSrc <= (ulong *)((long)puVar8 - (uVar10 >> 3));
            uVar11 = (int)puVar8 - iVar7;
            if (bVar16) {
              uVar11 = (uint)(uVar10 >> 3);
            }
            uVar13 = uVar13 + uVar11 * -8;
          }
          else {
            uVar11 = (uint)(uVar10 >> 3);
            uVar13 = uVar13 & 7;
            bVar16 = true;
          }
          uVar10 = (ulong)uVar13;
          puVar8 = (ulong *)((long)puVar8 - (ulong)uVar11);
          uVar5 = *puVar8;
        }
        else {
LAB_001c147f:
          bVar16 = false;
        }
        if (((undefined2 *)((long)puVar1 - 7U) <= dst) || (!bVar16)) goto LAB_001c159c;
        uVar12 = (uVar5 << (uVar10 & 0x3f)) >> uVar15;
        *(short *)dst = (short)DTable[uVar12 + 1];
        uVar13 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + (int)uVar10;
        uVar10 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
        uVar12 = (uVar5 << ((ulong)uVar13 & 0x3f)) >> uVar15;
        *(short *)((long)dst + uVar10) = (short)DTable[uVar12 + 1];
        uVar13 = *(byte *)((long)DTable + uVar12 * 4 + 6) + uVar13;
        uVar12 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
        lVar3 = uVar12 + uVar10;
        uVar14 = (uVar5 << ((ulong)uVar13 & 0x3f)) >> uVar15;
        *(short *)((long)dst + uVar12 + uVar10) = (short)DTable[uVar14 + 1];
        uVar13 = *(byte *)((long)DTable + uVar14 * 4 + 6) + uVar13;
        uVar14 = (ulong)*(byte *)((long)DTable + uVar14 * 4 + 7);
        uVar12 = (uVar5 << ((ulong)uVar13 & 0x3f)) >> uVar15;
        *(short *)((long)dst + uVar14 + lVar3) = (short)DTable[uVar12 + 1];
        uVar10 = (ulong)(*(byte *)((long)DTable + uVar12 * 4 + 6) + uVar13);
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7) + uVar14 + lVar3)
        ;
      } while( true );
    }
    do {
      uVar13 = (uint)uVar10;
      if (uVar13 < 0x41) {
        if (puVar8 < puVar6) {
          if (puVar8 == (ulong *)cSrc) goto LAB_001c1305;
          bVar16 = cSrc <= (ulong *)((long)puVar8 - (uVar10 >> 3));
          uVar11 = (int)puVar8 - iVar7;
          if (bVar16) {
            uVar11 = (uint)(uVar10 >> 3);
          }
          uVar13 = uVar13 + uVar11 * -8;
        }
        else {
          uVar11 = (uint)(uVar10 >> 3);
          uVar13 = uVar13 & 7;
          bVar16 = true;
        }
        uVar10 = (ulong)uVar13;
        puVar8 = (ulong *)((long)puVar8 - (ulong)uVar11);
        uVar5 = *puVar8;
      }
      else {
LAB_001c1305:
        bVar16 = false;
      }
      if (((undefined2 *)((long)puVar1 - 9U) <= dst) || (!bVar16)) goto LAB_001c159c;
      uVar12 = (uVar5 << (uVar10 & 0x3f)) >> uVar15;
      *(short *)dst = (short)DTable[uVar12 + 1];
      uVar13 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + (int)uVar10;
      uVar12 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
      uVar10 = (uVar5 << ((ulong)uVar13 & 0x3f)) >> uVar15;
      *(short *)((long)dst + uVar12) = (short)DTable[uVar10 + 1];
      uVar13 = *(byte *)((long)DTable + uVar10 * 4 + 6) + uVar13;
      uVar10 = (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7);
      lVar3 = uVar10 + uVar12;
      uVar14 = (uVar5 << ((ulong)uVar13 & 0x3f)) >> uVar15;
      *(short *)((long)dst + uVar10 + uVar12) = (short)DTable[uVar14 + 1];
      uVar13 = *(byte *)((long)DTable + uVar14 * 4 + 6) + uVar13;
      uVar10 = (ulong)*(byte *)((long)DTable + uVar14 * 4 + 7);
      lVar4 = uVar10 + lVar3;
      uVar12 = (uVar5 << ((ulong)uVar13 & 0x3f)) >> uVar15;
      *(short *)((long)dst + uVar10 + lVar3) = (short)DTable[uVar12 + 1];
      uVar13 = *(byte *)((long)DTable + uVar12 * 4 + 6) + uVar13;
      uVar12 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
      uVar14 = (uVar5 << ((ulong)uVar13 & 0x3f)) >> uVar15;
      *(short *)((long)dst + uVar12 + lVar4) = (short)DTable[uVar14 + 1];
      uVar10 = (ulong)(*(byte *)((long)DTable + uVar14 * 4 + 6) + uVar13);
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar14 * 4 + 7) + uVar12 + lVar4);
    } while( true );
  }
  uVar15 = (uint)uVar10;
  if (uVar15 < 0x41) {
    if (puVar8 < puVar6) {
      if (puVar8 == (ulong *)cSrc) goto LAB_001c159c;
      uVar13 = (int)puVar8 - iVar7;
      if (cSrc <= (ulong *)((long)puVar8 - (uVar10 >> 3))) {
        uVar13 = (uint)(uVar10 >> 3);
      }
      uVar15 = uVar15 + uVar13 * -8;
    }
    else {
      uVar13 = (uint)(uVar10 >> 3);
      uVar15 = uVar15 & 7;
    }
    uVar10 = (ulong)uVar15;
    puVar8 = (ulong *)((long)puVar8 - (ulong)uVar13);
    uVar5 = *puVar8;
  }
LAB_001c159c:
  if (1 < (ulong)((long)puVar1 - (long)dst)) {
    uVar15 = -(uVar9 >> 0x10) & 0x3f;
    do {
      uVar13 = (uint)uVar10;
      if (uVar13 < 0x41) {
        if (puVar8 < puVar6) {
          if (puVar8 == (ulong *)cSrc) goto LAB_001c15c3;
          bVar16 = cSrc <= (ulong *)((long)puVar8 - (uVar10 >> 3));
          uVar11 = (int)puVar8 - iVar7;
          if (bVar16) {
            uVar11 = (uint)(uVar10 >> 3);
          }
          uVar13 = uVar13 + uVar11 * -8;
        }
        else {
          uVar11 = (uint)(uVar10 >> 3);
          uVar13 = uVar13 & 7;
          bVar16 = true;
        }
        uVar10 = (ulong)uVar13;
        puVar8 = (ulong *)((long)puVar8 - (ulong)uVar11);
        uVar5 = *puVar8;
      }
      else {
LAB_001c15c3:
        bVar16 = false;
      }
      if ((puVar1 + -1 < dst) || (!bVar16)) goto LAB_001c1675;
      uVar12 = (uVar5 << (uVar10 & 0x3f)) >> uVar15;
      *(short *)dst = (short)DTable[uVar12 + 1];
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7));
      uVar10 = (ulong)((uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + (int)uVar10);
    } while( true );
  }
LAB_001c167d:
  uVar15 = (uint)uVar10;
  if (dst < puVar1) {
    uVar5 = (uVar5 << (uVar10 & 0x3f)) >> ((ulong)(byte)-(char)(uVar9 >> 0x10) & 0x3f);
    *(char *)dst = (char)DTable[uVar5 + 1];
    if (*(char *)((long)DTable + uVar5 * 4 + 7) == '\x01') {
      uVar15 = uVar15 + *(byte *)((long)DTable + uVar5 * 4 + 6);
    }
    else if (uVar15 < 0x40) {
      uVar9 = uVar15 + *(byte *)((long)DTable + uVar5 * 4 + 6);
      uVar15 = 0x40;
      if (uVar9 < 0x40) {
        uVar15 = uVar9;
      }
    }
  }
  if (uVar15 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar8 != (ulong *)cSrc) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
LAB_001c1675:
  for (; dst <= puVar1 + -1;
      dst = (void *)((ulong)*(byte *)((long)DTable + uVar12 * 4 + 7) + (long)dst)) {
    uVar12 = (uVar5 << (uVar10 & 0x3f)) >> uVar15;
    *(short *)dst = (short)DTable[uVar12 + 1];
    uVar10 = (ulong)((uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + (int)uVar10);
  }
  goto LAB_001c167d;
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { ZSTD_memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                ZSTD_FALLTHROUGH;

        case 6: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                ZSTD_FALLTHROUGH;

        case 5: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                ZSTD_FALLTHROUGH;

        case 4: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[3]) << 24;
                ZSTD_FALLTHROUGH;

        case 3: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[2]) << 16;
                ZSTD_FALLTHROUGH;

        case 2: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[1]) <<  8;
                ZSTD_FALLTHROUGH;

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}